

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall Timer::stop(Timer *this)

{
  SharedPtr loop;
  EventLoop *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (this->timerId != 0) {
    EventLoop::eventLoop();
    if (local_20 != (EventLoop *)0x0) {
      EventLoop::unregisterTimer(local_20,this->timerId);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    this->timerId = 0;
  }
  return;
}

Assistant:

void Timer::stop()
{
    if (timerId) {
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->unregisterTimer(timerId);
        }
        timerId = 0;
    }
}